

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O0

void __thiscall QTextBrowserPrivate::documentModified(QTextBrowserPrivate *this)

{
  bool bVar1;
  long in_RDI;
  long in_FS_OFFSET;
  QFlags<QUrl::ComponentFormattingOption> *in_stack_ffffffffffffffc0;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 *)(in_RDI + 0x420) = 1;
  QFlags<QUrl::ComponentFormattingOption>::QFlags
            (in_stack_ffffffffffffffc0,(ComponentFormattingOption)((ulong)(in_RDI + 0x400) >> 0x20))
  ;
  QUrl::path((QFlags_conflict1 *)local_20);
  bVar1 = QString::isEmpty((QString *)0x6e0c86);
  *(bool *)(in_RDI + 0x421) = !bVar1;
  QString::~QString((QString *)0x6e0ca0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void documentModified()
    {
        textOrSourceChanged = true;
        forceLoadOnSourceChange = !currentURL.path().isEmpty();
    }